

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isgraph.c
# Opt level: O0

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x61] & 0x8000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1a,"isgraph( \'a\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x7a] & 0x8000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1b,"isgraph( \'z\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x41] & 0x8000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1c,"isgraph( \'A\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x5a] & 0x8000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1d,"isgraph( \'Z\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x40] & 0x8000) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1e,"isgraph( \'@\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[9] & 0x8000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1f,"! isgraph( \'\\t\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if ((**ppuVar1 & 0x8000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x20,"! isgraph( \'\\0\' )");
  }
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[0x20] & 0x8000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x21,"! isgraph( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isgraph( 'a' ) );
    TESTCASE( isgraph( 'z' ) );
    TESTCASE( isgraph( 'A' ) );
    TESTCASE( isgraph( 'Z' ) );
    TESTCASE( isgraph( '@' ) );
    TESTCASE( ! isgraph( '\t' ) );
    TESTCASE( ! isgraph( '\0' ) );
    TESTCASE( ! isgraph( ' ' ) );
    return TEST_RESULTS;
}